

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void DecideOverLiteralContextModeling
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,int quality,
               ContextType *literal_context_mode,size_t *num_literal_contexts,
               uint32_t **literal_context_map)

{
  byte bVar1;
  int iVar2;
  ulong uStack_80;
  uint8_t literal;
  size_t pos;
  int prev;
  size_t stride_end_pos;
  uint32_t bigram_prefix_histo [9];
  size_t end_pos;
  ContextType *literal_context_mode_local;
  int quality_local;
  size_t mask_local;
  size_t length_local;
  size_t start_pos_local;
  uint8_t *input_local;
  
  if ((4 < quality) && (0x3f < length)) {
    register0x00000000 = start_pos + length;
    memset(&stride_end_pos,0,0x24);
    for (length_local = start_pos; length_local + 0x40 <= stack0xffffffffffffffc0;
        length_local = length_local + 0x1000) {
      iVar2 = DecideOverLiteralContextModeling::lut[(int)(uint)input[length_local & mask] >> 6];
      uStack_80 = length_local;
      while( true ) {
        pos._4_4_ = iVar2 * 3;
        uStack_80 = uStack_80 + 1;
        if (length_local + 0x40 <= uStack_80) break;
        bVar1 = input[uStack_80 & mask];
        bigram_prefix_histo
        [(long)(pos._4_4_ + DecideOverLiteralContextModeling::lut[(int)(uint)bVar1 >> 6]) + -2] =
             bigram_prefix_histo
             [(long)(pos._4_4_ + DecideOverLiteralContextModeling::lut[(int)(uint)bVar1 >> 6]) + -2]
             + 1;
        iVar2 = DecideOverLiteralContextModeling::lut[(int)(uint)bVar1 >> 6];
      }
    }
    *literal_context_mode = CONTEXT_UTF8;
    ChooseContextMap(quality,(uint32_t *)&stride_end_pos,num_literal_contexts,literal_context_map);
  }
  return;
}

Assistant:

static void DecideOverLiteralContextModeling(const uint8_t* input,
    size_t start_pos, size_t length, size_t mask, int quality,
    ContextType* literal_context_mode, size_t* num_literal_contexts,
    const uint32_t** literal_context_map) {
  if (quality < MIN_QUALITY_FOR_CONTEXT_MODELING || length < 64) {
    return;
  } else {
    /* Gather bi-gram data of the UTF8 byte prefixes. To make the analysis of
       UTF8 data faster we only examine 64 byte long strides at every 4kB
       intervals. */
    const size_t end_pos = start_pos + length;
    uint32_t bigram_prefix_histo[9] = { 0 };
    for (; start_pos + 64 <= end_pos; start_pos += 4096) {
      static const int lut[4] = { 0, 0, 1, 2 };
      const size_t stride_end_pos = start_pos + 64;
      int prev = lut[input[start_pos & mask] >> 6] * 3;
      size_t pos;
      for (pos = start_pos + 1; pos < stride_end_pos; ++pos) {
        const uint8_t literal = input[pos & mask];
        ++bigram_prefix_histo[prev + lut[literal >> 6]];
        prev = lut[literal >> 6] * 3;
      }
    }
    *literal_context_mode = CONTEXT_UTF8;
    ChooseContextMap(quality, &bigram_prefix_histo[0], num_literal_contexts,
                     literal_context_map);
  }
}